

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::DoAllAction::operator_cast_to_Action(DoAllAction *this,Op *param_1)

{
  Op *param_1_local;
  Op *this_local;
  
  std::
  vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
  ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            *)this,&param_1->converted);
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  ::Action((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
            *)(this + 0x18),&param_1->last);
  return;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    struct Op {
      std::vector<Action<void(NonFinalType<Args>...)>> converted;
      Action<R(Args...)> last;
      R operator()(Args... args) const {
        auto tuple_args = std::forward_as_tuple(std::forward<Args>(args)...);
        for (auto& a : converted) {
          a.Perform(tuple_args);
        }
        return last.Perform(std::move(tuple_args));
      }
    };
    return Op{Convert<Action<void(NonFinalType<Args>...)>>(
                  MakeIndexSequence<sizeof...(Actions) - 1>()),
              std::get<sizeof...(Actions) - 1>(actions)};
  }